

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O0

void __thiscall
TransitionObservationIndependentMADPDiscrete::SetISD
          (TransitionObservationIndependentMADPDiscrete *this,
          vector<double,_std::allocator<double>_> *v)

{
  undefined8 uVar1;
  size_type sVar2;
  void *pvVar3;
  E *in_RSI;
  long in_RDI;
  SDV *in_stack_ffffffffffffffc8;
  StateDistributionVector *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffe8;
  
  if (*(long *)(in_RDI + 0x1d0) == 0) {
    uVar1 = __cxa_allocate_exception(0x28);
    E::E(in_RSI,in_stack_ffffffffffffffe8);
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  }
  sVar2 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)in_RSI);
  if (sVar2 != *(size_type *)(in_RDI + 0x1d0)) {
    uVar1 = __cxa_allocate_exception(0x28);
    E::E(in_RSI,in_stack_ffffffffffffffe8);
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  }
  if (*(long **)(in_RDI + 0x1d8) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x1d8) + 8))();
  }
  pvVar3 = operator_new(0x20);
  StateDistributionVector::StateDistributionVector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *(void **)(in_RDI + 0x1d8) = pvVar3;
  return;
}

Assistant:

void  TransitionObservationIndependentMADPDiscrete::SetISD(const vector<double> &v)
{
    if(_m_nrJointStates==0)
        throw(E("TransitionObservationIndependentMADPDiscrete::CreateISD() joint states should have been created already"));
    
    if(v.size() != _m_nrJointStates)
        throw E("TransitionObservationIndependentMADPDiscrete::SetISD - ERROR: nrStates don't match!");

    delete _m_initialStateDistribution;
    _m_initialStateDistribution = new StateDistributionVector(v);
}